

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathErr(void)

{
  int iVar1;
  int iVar2;
  uint local_24;
  int n_error;
  int error;
  int n_ctxt;
  xmlXPathParserContextPtr ctxt;
  int mem_base;
  int test_ret;
  
  ctxt._4_4_ = 0;
  for (n_error = 0; n_error < 1; n_error = n_error + 1) {
    for (local_24 = 0; (int)local_24 < 4; local_24 = local_24 + 1) {
      iVar1 = xmlMemBlocks();
      iVar2 = gen_int(local_24,1);
      xmlXPathErr(0,iVar2);
      call_tests = call_tests + 1;
      des_int(local_24,iVar2,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathErr",(ulong)(uint)(iVar2 - iVar1));
        ctxt._4_4_ = ctxt._4_4_ + 1;
        printf(" %d",(ulong)(uint)n_error);
        printf(" %d",(ulong)local_24);
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ctxt._4_4_;
}

Assistant:

static int
test_xmlXPathErr(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    xmlXPathParserContextPtr ctxt; /* a XPath parser context */
    int n_ctxt;
    int error; /* the error code */
    int n_error;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlXPathParserContextPtr;n_ctxt++) {
    for (n_error = 0;n_error < gen_nb_int;n_error++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlXPathParserContextPtr(n_ctxt, 0);
        error = gen_int(n_error, 1);

        xmlXPathErr(ctxt, error);
        call_tests++;
        des_xmlXPathParserContextPtr(n_ctxt, ctxt, 0);
        des_int(n_error, error, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathErr",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_error);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}